

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<capnp::Schema>::dispose(ArrayBuilder<capnp::Schema> *this)

{
  Schema *firstElement;
  RemoveConst<capnp::Schema> *pRVar1;
  Schema *pSVar2;
  Schema *endCopy;
  Schema *posCopy;
  Schema *ptrCopy;
  ArrayBuilder<capnp::Schema> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pSVar2 = this->endPtr;
  if (firstElement != (Schema *)0x0) {
    this->ptr = (Schema *)0x0;
    this->pos = (RemoveConst<capnp::Schema> *)0x0;
    this->endPtr = (Schema *)0x0;
    ArrayDisposer::dispose<capnp::Schema>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pSVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }